

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

int ovf::detail::parse::segment_header(ovf_file *file,int index,ovf_segment *segment)

{
  reference pvVar1;
  ostream *this;
  int *in_R8;
  string line;
  value_type p;
  memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_1;
  keyword_value_line_error *err;
  parse_error *err_1;
  exception ex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_85;
  bool success;
  undefined1 local_78 [8];
  memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in;
  ovf_segment *segment_local;
  int index_local;
  ovf_file *file_local;
  
  in.
  super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_source.field_2._8_8_ = segment;
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&file->_state->file_contents,(long)index);
  tao::pegtl::
  memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>::
  memory_input<char_const(&)[1]>
            ((memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
              *)local_78,pvVar1,(char (*) [1])0x1d6b50);
  file->_state->found_title = false;
  file->_state->found_meshunit = false;
  file->_state->found_valuedim = false;
  file->_state->found_valueunits = false;
  file->_state->found_valuelabels = false;
  file->_state->found_xmin = false;
  file->_state->found_ymin = false;
  file->_state->found_zmin = false;
  file->_state->found_xmax = false;
  file->_state->found_ymax = false;
  file->_state->found_zmax = false;
  file->_state->found_meshtype = false;
  file->_state->found_xbase = false;
  file->_state->found_ybase = false;
  file->_state->found_zbase = false;
  file->_state->found_xstepsize = false;
  file->_state->found_ystepsize = false;
  file->_state->found_zstepsize = false;
  file->_state->found_xnodes = false;
  file->_state->found_ynodes = false;
  file->_state->found_znodes = false;
  file->_state->found_pointcount = false;
  local_85 = 0;
  if (file->version == 2) {
    local_85 = tao::pegtl::
               parse<tao::pegtl::plus<ovf::detail::parse::v2::segment_header>,_ovf::detail::parse::v2::ovf_segment_header_action,_ovf::detail::parse::v2::ovf_segment_header_control,_(tao::pegtl::apply_mode)1,_(tao::pegtl::rewind_mode)1,_tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_ovf_file_&,_ovf_segment_&>
                         ((memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_78,file,
                          (ovf_segment *)
                          in.
                          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .m_source.field_2._8_8_);
    if ((bool)local_85) {
      file_local._4_4_ = -1;
    }
    else {
      std::__cxx11::string::operator=
                ((string *)&file->_state->message_latest,
                 "libovf segment_header: no success in parsing");
      pvVar1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&file->_state->file_contents,(long)index);
      this = std::operator<<((ostream *)&std::cerr,(string *)pvVar1);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      file_local._4_4_ = -3;
    }
  }
  else if (file->version == 1) {
    fmt::v5::format<char[73],char_const*,int>
              (&local_a8,
               (v5 *)"libovf segment_header: OVF version \'{}\' in file \'{}\' is not supported...",
               (char (*) [73])file,(char **)&file->version,in_R8);
    std::__cxx11::string::operator=((string *)&file->_state->message_latest,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    file_local._4_4_ = -3;
  }
  else {
    fmt::v5::format<char[73],char_const*,int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ex,
               (v5 *)"libovf segment_header: OVF version \'{}\' in file \'{}\' is not supported...",
               (char (*) [73])file,(char **)&file->version,in_R8);
    std::__cxx11::string::operator=((string *)&file->_state->message_latest,(string *)&ex);
    std::__cxx11::string::~string((string *)&ex);
    file_local._4_4_ = -3;
  }
  tao::pegtl::
  memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~memory_input((memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_78);
  return file_local._4_4_;
}

Assistant:

inline int segment_header(ovf_file & file, int index, ovf_segment & segment)
    try
    {
        pegtl::memory_input<> in( file._state->file_contents[index], "" );
        file._state->found_title        = false;
        file._state->found_meshunit     = false;
        file._state->found_valuedim     = false;
        file._state->found_valueunits   = false;
        file._state->found_valuelabels  = false;
        file._state->found_xmin         = false;
        file._state->found_ymin         = false;
        file._state->found_zmin         = false;
        file._state->found_xmax         = false;
        file._state->found_ymax         = false;
        file._state->found_zmax         = false;
        file._state->found_meshtype     = false;
        file._state->found_xbase        = false;
        file._state->found_ybase        = false;
        file._state->found_zbase        = false;
        file._state->found_xstepsize    = false;
        file._state->found_ystepsize    = false;
        file._state->found_zstepsize    = false;
        file._state->found_xnodes       = false;
        file._state->found_ynodes       = false;
        file._state->found_znodes       = false;
        file._state->found_pointcount   = false;
        bool success = false;

        if( file.version == 2 )
        {
            success = pegtl::parse< pegtl::plus<v2::segment_header>, v2::ovf_segment_header_action, v2::ovf_segment_header_control >( in, file, segment );
        }
        else if( file.version == 1 )
        {
            // TODO...
            file._state->message_latest = fmt::format(
                "libovf segment_header: OVF version \'{}\' in file \'{}\' is not supported...",
                file.file_name, file.version);
            return OVF_INVALID;
        }
        else
        {
            file._state->message_latest = fmt::format(
                "libovf segment_header: OVF version \'{}\' in file \'{}\' is not supported...",
                file.file_name, file.version);
            return OVF_INVALID;
        }

        if( success )
            return OVF_OK;
        else
        {
            file._state->message_latest = "libovf segment_header: no success in parsing";
            std::cerr << file._state->file_contents[index] << std::endl;
            return OVF_INVALID;
        }
    }
    catch( v2::keyword_value_line_error & err )
    {
        pegtl::memory_input<> in( file._state->file_contents[index], "" );
        const auto p = err.positions.front();
        std::string line = in.line_at(p);
        file._state->message_latest = fmt::format(
            "libovf segment_header: Expected an empty line or a line containing a keyword and a value!"
            "Found the following line instead:\n\"{}\"", line);
        return OVF_ERROR;
    }
    catch( pegtl::parse_error & err )
    {
        file._state->message_latest = fmt::format(
            "libovf segment_header: pegtl parse error \'{}\'", + err.what());
        return OVF_ERROR;
    }
    catch( std::exception ex )
    {
        file._state->message_latest = fmt::format(
            "libovf segment_header: std::exception \'{}\'", + ex.what());
        return OVF_ERROR;
    }
    catch( ... )
    {
        file._state->message_latest = "libovf segment_header: unknown exception";
        return OVF_ERROR;
    }